

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# particle_decay.cpp
# Opt level: O2

void __thiscall
particle_decay::perform_three_body_decay
          (particle_decay *this,particle_info *mother,particle_info *daughter1,
          particle_info *daughter2,particle_info *daughter3)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  undefined1 auVar9 [16];
  undefined4 uVar10;
  mapped_type *pmVar11;
  ostream *poVar12;
  long lVar13;
  particle_info *ppVar14;
  key_type *pkVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  undefined1 auVar20 [16];
  double dVar21;
  ulong uVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  double dVar30;
  double dVar31;
  double dVar32;
  double dVar33;
  double dVar34;
  double dVar35;
  double dVar36;
  double dVar37;
  double dVar38;
  double dVar39;
  double dVar40;
  double dVar41;
  double dVar42;
  key_type local_a0 [30];
  
  dVar29 = mother->mass;
  ppVar14 = mother;
  pkVar15 = local_a0;
  for (lVar13 = 0xf; lVar13 != 0; lVar13 = lVar13 + -1) {
    uVar10 = *(undefined4 *)&ppVar14->field_0x4;
    pkVar15[0] = ppVar14->monval;
    pkVar15[1] = uVar10;
    ppVar14 = (particle_info *)&ppVar14->mass;
    pkVar15 = pkVar15 + 2;
  }
  pmVar11 = std::
            map<int,_particle_decay_info,_std::less<int>,_std::allocator<std::pair<const_int,_particle_decay_info>_>_>
            ::at(&this->resonance_table_,local_a0);
  dVar36 = daughter1->mass;
  dVar18 = daughter2->mass;
  dVar19 = daughter3->mass;
  if (dVar36 + dVar18 + dVar19 <= dVar29) {
    dVar17 = pmVar11->width;
    dVar28 = ((dVar29 - dVar36) - dVar18) - dVar19;
    do {
      do {
        dVar31 = RandomUtil::Random::rand_uniform
                           ((this->ran_gen_ptr_).
                            super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr);
        dVar31 = dVar31 * dVar28 + dVar36;
        dVar32 = RandomUtil::Random::rand_uniform
                           ((this->ran_gen_ptr_).
                            super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr);
        dVar32 = dVar32 * dVar28 + dVar18;
      } while (dVar29 < dVar31 + dVar32);
      dVar23 = dVar31 * dVar31 + -dVar36 * dVar36;
      if (dVar23 < 0.0) {
        dVar23 = sqrt(dVar23);
      }
      else {
        dVar23 = SQRT(dVar23);
      }
      dVar21 = dVar32 * dVar32 + -dVar18 * dVar18;
      if (dVar21 < 0.0) {
        dVar21 = sqrt(dVar21);
      }
      else {
        dVar21 = SQRT(dVar21);
      }
      dVar32 = (dVar29 - dVar31) - dVar32;
      dVar31 = (((dVar32 * dVar32 - dVar23 * dVar23) - dVar21 * dVar21) + -dVar19 * dVar19) /
               ((dVar23 + dVar23) * dVar21);
    } while (1.0 < ABS(dVar31));
    if (dVar17 <= 1e-10) {
      dVar29 = 10000000000.0;
    }
    else {
      dVar28 = mother->E;
      dVar32 = RandomUtil::Random::rand_uniform
                         ((this->ran_gen_ptr_).
                          super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
      ;
      dVar32 = log(dVar32);
      dVar29 = dVar32 * ((dVar28 / dVar29) / dVar17) * -0.19733;
    }
    dVar28 = mother->t + dVar29;
    dVar17 = mother->E;
    dVar32 = (mother->pz / dVar17) * dVar29 + mother->z;
    dVar24 = dVar21 * dVar31;
    dVar31 = 1.0 - dVar31 * dVar31;
    dVar25 = -(dVar23 + dVar24);
    dVar33 = mother->x;
    dVar34 = mother->y;
    auVar20._0_8_ = mother->px;
    auVar20._8_8_ = mother->py;
    auVar9._8_8_ = dVar17;
    auVar9._0_8_ = dVar17;
    auVar20 = divpd(auVar20,auVar9);
    if (dVar31 < 0.0) {
      dVar31 = sqrt(dVar31);
    }
    else {
      dVar31 = SQRT(dVar31);
    }
    dVar21 = dVar21 * dVar31;
    dVar17 = -dVar21;
    dVar31 = RandomUtil::Random::rand_uniform
                       ((this->ran_gen_ptr_).
                        super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    dVar4 = RandomUtil::Random::rand_uniform
                      ((this->ran_gen_ptr_).
                       super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    dVar37 = RandomUtil::Random::rand_uniform
                       ((this->ran_gen_ptr_).
                        super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    dVar37 = dVar37 + dVar37 + -1.0;
    dVar5 = sin(dVar31 * 6.283185307179586);
    dVar31 = cos(dVar31 * 6.283185307179586);
    dVar6 = sin(dVar4 * 6.283185307179586);
    dVar4 = cos(dVar4 * 6.283185307179586);
    dVar40 = 1.0 - dVar37 * dVar37;
    if (dVar40 < 0.0) {
      dVar40 = sqrt(dVar40);
    }
    else {
      dVar40 = SQRT(dVar40);
    }
    uVar22 = (ulong)DAT_00146800;
    dVar33 = auVar20._0_8_ * dVar29 + dVar33;
    dVar34 = auVar20._8_8_ * dVar29 + dVar34;
    dVar30 = dVar23 * dVar37;
    dVar7 = dVar31 * dVar40 * dVar21 + dVar24 * dVar37;
    dVar38 = dVar31 * dVar17 * dVar40 + dVar25 * dVar37;
    dVar29 = mother->E;
    dVar39 = mother->pz / dVar29;
    dVar26 = -dVar23 * dVar40 * dVar4;
    dVar27 = dVar23 * dVar40 * dVar6;
    auVar1._0_8_ = mother->px;
    auVar1._8_8_ = mother->py;
    auVar2._8_4_ = SUB84(dVar29,0);
    auVar2._0_8_ = dVar29;
    auVar2._12_4_ = (int)((ulong)dVar29 >> 0x20);
    auVar20 = divpd(auVar1,auVar2);
    dVar42 = auVar20._8_8_;
    dVar41 = auVar20._0_8_;
    dVar35 = dVar39 * dVar39 + dVar41 * dVar41 + dVar42 * dVar42;
    dVar29 = 1.0 - dVar35;
    dVar36 = SQRT(dVar30 * dVar30 + dVar27 * dVar27 + dVar36 * dVar36 + dVar26 * dVar26);
    if (dVar29 < 0.0) {
      dVar29 = sqrt(dVar29);
    }
    else {
      dVar29 = SQRT(dVar29);
    }
    dVar29 = 1.0 / dVar29;
    dVar16 = dVar39 * dVar30 + dVar41 * dVar26 + dVar27 * dVar42;
    daughter1->E = (dVar36 + dVar16) * dVar29;
    dVar8 = dVar29 + -1.0;
    dVar36 = (dVar16 * dVar8) / dVar35 + dVar29 * dVar36;
    daughter1->px = dVar36 * dVar41 + dVar26;
    daughter1->py = dVar36 * dVar42 + dVar27;
    daughter1->pz = dVar36 * dVar39 + dVar30;
    dVar26 = dVar31 * dVar37 * dVar4 + (double)((ulong)dVar5 ^ uVar22) * dVar6;
    dVar37 = (double)(uVar22 ^ (ulong)dVar31) * dVar37 * dVar6 +
             (double)((ulong)dVar5 ^ uVar22) * dVar4;
    dVar31 = dVar21 * dVar26 + (double)((ulong)(dVar24 * dVar40) ^ uVar22) * dVar4;
    dVar21 = dVar21 * dVar37 + dVar24 * dVar40 * dVar6;
    dVar36 = dVar39 * dVar7 + dVar41 * dVar31 + dVar21 * dVar42;
    daughter1->t = dVar28;
    daughter1->x = dVar33;
    daughter1->y = dVar34;
    daughter1->z = dVar32;
    dVar18 = SQRT(dVar7 * dVar7 + dVar21 * dVar21 + dVar18 * dVar18 + dVar31 * dVar31);
    daughter2->E = (dVar36 + dVar18) * dVar29;
    dVar36 = dVar18 * dVar29 + (dVar8 * dVar36) / dVar35;
    daughter2->px = dVar36 * dVar41 + dVar31;
    daughter2->py = dVar36 * dVar42 + dVar21;
    daughter2->pz = dVar36 * dVar39 + dVar7;
    dVar36 = dVar17 * dVar26 + dVar4 * (dVar23 + dVar24) * dVar40;
    dVar18 = dVar17 * dVar37 + dVar25 * dVar6 * dVar40;
    dVar17 = dVar39 * dVar38 + dVar41 * dVar36 + dVar18 * dVar42;
    daughter2->t = dVar28;
    daughter2->x = dVar33;
    daughter2->y = dVar34;
    daughter2->z = dVar32;
    dVar19 = SQRT(dVar38 * dVar38 + dVar18 * dVar18 + dVar19 * dVar19 + dVar36 * dVar36);
    daughter3->E = (dVar17 + dVar19) * dVar29;
    dVar29 = dVar29 * dVar19 + (dVar8 * dVar17) / dVar35;
    dVar36 = dVar29 * dVar41 + dVar36;
    dVar18 = dVar29 * dVar42 + dVar18;
    auVar3._8_4_ = SUB84(dVar18,0);
    auVar3._0_8_ = dVar36;
    auVar3._12_4_ = (int)((ulong)dVar18 >> 0x20);
    daughter3->px = dVar36;
    daughter3->py = (double)auVar3._8_8_;
    daughter3->pz = dVar29 * dVar39 + dVar38;
    daughter3->t = dVar28;
    daughter3->x = dVar33;
    daughter3->y = dVar34;
    daughter3->z = dVar32;
    return;
  }
  poVar12 = std::operator<<((ostream *)&std::cout,"Error:particleSamples::perform_three_body_decay:"
                           );
  poVar12 = std::operator<<(poVar12,"can not found decays!");
  std::endl<char,std::char_traits<char>>(poVar12);
  poVar12 = std::operator<<((ostream *)&std::cout,"M = ");
  poVar12 = (ostream *)std::ostream::operator<<(poVar12,dVar29);
  poVar12 = std::operator<<(poVar12,", m1 = ");
  poVar12 = (ostream *)std::ostream::operator<<(poVar12,dVar36);
  poVar12 = std::operator<<(poVar12,", m2 = ");
  poVar12 = (ostream *)std::ostream::operator<<(poVar12,dVar18);
  poVar12 = std::operator<<(poVar12,", m3 = ");
  poVar12 = (ostream *)std::ostream::operator<<(poVar12,dVar19);
  std::endl<char,std::char_traits<char>>(poVar12);
  poVar12 = std::operator<<((ostream *)&std::cout,"reso: ");
  poVar12 = (ostream *)std::ostream::operator<<(poVar12,mother->monval);
  poVar12 = std::operator<<(poVar12,", m1: ");
  poVar12 = (ostream *)std::ostream::operator<<(poVar12,daughter1->monval);
  poVar12 = std::operator<<(poVar12,", m2: ");
  poVar12 = (ostream *)std::ostream::operator<<(poVar12,daughter2->monval);
  poVar12 = std::operator<<(poVar12,", m3: ");
  poVar12 = (ostream *)std::ostream::operator<<(poVar12,daughter3->monval);
  std::endl<char,std::char_traits<char>>(poVar12);
  exit(1);
}

Assistant:

void particle_decay::perform_three_body_decay(
    particle_info &mother, particle_info &daughter1, particle_info &daughter2,
    particle_info &daughter3) {
    double M_pole = mother.mass;
    double M_width = get_particle_width(mother);
    double m1 = daughter1.mass;
    double m2 = daughter2.mass;
    double m3 = daughter3.mass;
    double M_min = m1 + m2 + m3;
    if (M_pole < M_min) {
        cout << "Error:particleSamples::perform_three_body_decay:"
             << "can not found decays!" << endl;
        cout << "M = " << M_pole << ", m1 = " << m1 << ", m2 = " << m2
             << ", m3 = " << m3 << endl;
        cout << "reso: " << mother.monval << ", m1: " << daughter1.monval
             << ", m2: " << daughter2.monval << ", m3: " << daughter3.monval
             << endl;
        exit(1);
    }
    // double M_sampled = sample_breit_wigner(M_pole, M_width, M_min);
    double M_sampled = M_pole;
    // generate lrf E1, E2, and theta12 using accept and reject method
    double E1_lrf, E2_lrf, E3_lrf, p1_lrf, p2_lrf, cos12_lrf;
    do {
        do {
            E1_lrf =
                ran_gen_ptr_->rand_uniform() * (M_sampled - m1 - m2 - m3) + m1;
            E2_lrf =
                ran_gen_ptr_->rand_uniform() * (M_sampled - m1 - m2 - m3) + m2;
        } while (E1_lrf + E2_lrf > M_sampled);
        p1_lrf = sqrt(E1_lrf * E1_lrf - m1 * m1);
        p2_lrf = sqrt(E2_lrf * E2_lrf - m2 * m2);
        double E3_lrf = M_sampled - E1_lrf - E2_lrf;
        cos12_lrf =
            (E3_lrf * E3_lrf - p1_lrf * p1_lrf - p2_lrf * p2_lrf - m3 * m3)
            / (2. * p1_lrf * p2_lrf);
    } while (cos12_lrf < -1.0 || cos12_lrf > 1.0);
    // now we get the a good sample

    // sample the lifetime
    double life_time = 1e10;
    if (M_width > 1e-10) {
        double tau = mother.E / (M_sampled) * 1. / M_width;
        life_time = -tau * log(ran_gen_ptr_->rand_uniform());
        life_time *= AfterburnerUtil::hbarc;  // convert unit to fm
    }
    // compute the decay position
    double decay_time = mother.t + life_time;
    double decay_x = mother.x + mother.px / mother.E * life_time;
    double decay_y = mother.y + mother.py / mother.E * life_time;
    double decay_z = mother.z + mother.pz / mother.E * life_time;

    // compute the momentum of decay daughters
    double tp2_lrf_x = p2_lrf * sqrt(1. - cos12_lrf * cos12_lrf);
    double tp2_lrf_z = p2_lrf * cos12_lrf;
    double tp3_lrf_x = -tp2_lrf_x;
    double tp3_lrf_z = -(p1_lrf + tp2_lrf_z);
    double phi = 2. * M_PI * ran_gen_ptr_->rand_uniform();
    double ksi = 2. * M_PI * ran_gen_ptr_->rand_uniform();
    double cos_theta = 2. * ran_gen_ptr_->rand_uniform() - 1.0;

    double sin_phi = sin(phi);
    double cos_phi = cos(phi);
    double sin_ksi = sin(ksi);
    double cos_ksi = cos(ksi);
    double sin_theta = sqrt(1. - cos_theta * cos_theta);

    double p1_lrf_x = -p1_lrf * sin_theta * cos_ksi;
    double p1_lrf_y = p1_lrf * sin_theta * sin_ksi;
    double p1_lrf_z = p1_lrf * cos_theta;
    E1_lrf = sqrt(
        m1 * m1 + p1_lrf_x * p1_lrf_x + p1_lrf_y * p1_lrf_y
        + p1_lrf_z * p1_lrf_z);
    double p2_lrf_x =
        (tp2_lrf_x * (cos_phi * cos_theta * cos_ksi - sin_phi * sin_ksi)
         - tp2_lrf_z * sin_theta * cos_ksi);
    double p2_lrf_y =
        (tp2_lrf_x * (-cos_phi * cos_theta * sin_ksi - sin_phi * cos_ksi)
         + tp2_lrf_z * sin_theta * sin_ksi);
    double p2_lrf_z = tp2_lrf_x * (cos_phi * sin_theta) + tp2_lrf_z * cos_theta;
    E2_lrf = sqrt(
        m2 * m2 + p2_lrf_x * p2_lrf_x + p2_lrf_y * p2_lrf_y
        + p2_lrf_z * p2_lrf_z);
    double p3_lrf_x =
        (tp3_lrf_x * (cos_phi * cos_theta * cos_ksi - sin_phi * sin_ksi)
         - tp3_lrf_z * sin_theta * cos_ksi);
    double p3_lrf_y =
        (tp3_lrf_x * (-cos_phi * cos_theta * sin_ksi - sin_phi * cos_ksi)
         + tp3_lrf_z * (sin_theta * sin_ksi));
    double p3_lrf_z = tp3_lrf_x * cos_phi * sin_theta + tp3_lrf_z * cos_theta;
    E3_lrf = sqrt(
        m3 * m3 + p3_lrf_x * p3_lrf_x + p3_lrf_y * p3_lrf_y
        + p3_lrf_z * p3_lrf_z);

    double vx = mother.px / mother.E;
    double vy = mother.py / mother.E;
    double vz = mother.pz / mother.E;
    double v2 = vx * vx + vy * vy + vz * vz;
    double gamma = 1. / sqrt(1. - v2);
    double gamma_m_1 = gamma - 1.;
    double vp1 = vx * p1_lrf_x + vy * p1_lrf_y + vz * p1_lrf_z;
    double vp2 = vx * p2_lrf_x + vy * p2_lrf_y + vz * p2_lrf_z;
    double vp3 = vx * p3_lrf_x + vy * p3_lrf_y + vz * p3_lrf_z;

    daughter1.E = gamma * (E1_lrf + vp1);
    daughter1.px = p1_lrf_x + (gamma_m_1 * vp1 / v2 + gamma * E1_lrf) * vx;
    daughter1.py = p1_lrf_y + (gamma_m_1 * vp1 / v2 + gamma * E1_lrf) * vy;
    daughter1.pz = p1_lrf_z + (gamma_m_1 * vp1 / v2 + gamma * E1_lrf) * vz;
    daughter1.t = decay_time;
    daughter1.x = decay_x;
    daughter1.y = decay_y;
    daughter1.z = decay_z;

    daughter2.E = gamma * (E2_lrf + vp2);
    daughter2.px = p2_lrf_x + (gamma_m_1 * vp2 / v2 + gamma * E2_lrf) * vx;
    daughter2.py = p2_lrf_y + (gamma_m_1 * vp2 / v2 + gamma * E2_lrf) * vy;
    daughter2.pz = p2_lrf_z + (gamma_m_1 * vp2 / v2 + gamma * E2_lrf) * vz;
    daughter2.t = decay_time;
    daughter2.x = decay_x;
    daughter2.y = decay_y;
    daughter2.z = decay_z;

    daughter3.E = gamma * (E3_lrf + vp3);
    daughter3.px = p3_lrf_x + (gamma_m_1 * vp3 / v2 + gamma * E3_lrf) * vx;
    daughter3.py = p3_lrf_y + (gamma_m_1 * vp3 / v2 + gamma * E3_lrf) * vy;
    daughter3.pz = p3_lrf_z + (gamma_m_1 * vp3 / v2 + gamma * E3_lrf) * vz;
    daughter3.t = decay_time;
    daughter3.x = decay_x;
    daughter3.y = decay_y;
    daughter3.z = decay_z;
}